

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O2

void __thiscall Graph::read_binary(Graph *this,string *_attribute_file,string *_graph_file)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  uint *puVar4;
  pointer ppVar5;
  char cVar6;
  uint uVar7;
  Edge *edge;
  unsigned_long uVar8;
  FILE *__stream;
  size_t sVar9;
  pointer pEVar10;
  ostream *poVar11;
  uint *puVar12;
  ulong uVar13;
  uint uVar14;
  VertexIdType *to_id;
  VertexIdType *__args;
  pointer ppVar15;
  uint uVar16;
  double dVar17;
  double dVar18;
  vector<Edge,_std::allocator<Edge>_> edges;
  vector<unsigned_int,_std::allocator<unsigned_int>_> out_positions_to_fill;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  position_pair;
  vector<unsigned_int,_std::allocator<unsigned_int>_> in_positions_to_fill;
  ifstream attribute_file;
  undefined4 uStack_234;
  char local_228 [504];
  
  uVar13 = (ulong)_attribute_file;
  edges.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&edges.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  edges.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  edges.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  std::ifstream::ifstream(&attribute_file,(string *)_attribute_file,_S_in);
  cVar6 = std::__basic_file<char>::is_open();
  if (cVar6 == '\0') {
    printf("/workspace/llm4binary/github/license_c_cmakelists/wuhao-wu-jiang[P]Personalized-PageRank/Graph.h; LINE %d; File Not Exists.\n"
           ,0xa1);
    poVar11 = std::operator<<((ostream *)&std::cout,(string *)_attribute_file);
    std::endl<char,std::char_traits<char>>(poVar11);
  }
  else {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&attribute_file,(string *)&edges);
    std::__cxx11::string::find((char)&edges,0x3d);
    std::__cxx11::string::substr((ulong)&out_positions_to_fill,(ulong)&edges);
    uVar8 = std::__cxx11::stoul((string *)&out_positions_to_fill,(size_t *)0x0,10);
    this->numOfVertices = (VertexIdType)uVar8;
    std::__cxx11::string::~string((string *)&out_positions_to_fill);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&attribute_file,(string *)&edges);
    std::__cxx11::string::find((char)&edges,0x3d);
    std::__cxx11::string::substr((ulong)&out_positions_to_fill,(ulong)&edges);
    uVar8 = std::__cxx11::stoul((string *)&out_positions_to_fill,(size_t *)0x0,10);
    this->numOfEdges = (EdgeSizeType)uVar8;
    std::__cxx11::string::~string((string *)&out_positions_to_fill);
    this->dummy_id = this->numOfVertices;
    printf("The Number of Vertices: %d\n");
    printf("The Number of Edges: %d\n",(ulong)this->numOfEdges);
    std::ifstream::close();
    std::ifstream::~ifstream(&attribute_file);
    std::__cxx11::string::~string((string *)&edges);
    dVar17 = getCurrentTime();
    std::vector<Edge,_std::allocator<Edge>_>::vector
              (&edges,(ulong)this->numOfEdges,(allocator_type *)&attribute_file);
    __stream = fopen((_graph_file->_M_dataplus)._M_p,"rb");
    if (__stream != (FILE *)0x0) {
      sVar9 = fread(edges.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                    super__Vector_impl_data._M_start,8,
                    (long)edges.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)edges.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3,__stream);
      printf("Returned Value of fread: %zu\n",sVar9);
      fclose(__stream);
      getCurrentTime();
      printf("Time Used For Loading BINARY : %.2f\n");
      this->numOfEdges = 0;
      this_00 = &this->out_degrees;
      puVar2 = (this->out_degrees).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->out_degrees).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish != puVar2) {
        (this->out_degrees).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar2;
      }
      _attribute_file = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (this_00,(ulong)(this->numOfVertices + 2),(value_type_conflict1 *)&attribute_file);
      puVar2 = (this->in_degrees).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      this_01 = &this->in_degrees;
      if ((this->in_degrees).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_finish != puVar2) {
        (this->in_degrees).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar2;
      }
      _attribute_file = (char *)(uVar13 & 0xffffffff00000000);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (this_01,(ulong)(this->numOfVertices + 2),(value_type_conflict1 *)&attribute_file);
      puVar2 = (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (pEVar10 = edges.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pEVar10 !=
          edges.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
          _M_finish; pEVar10 = pEVar10 + 1) {
        if (pEVar10->from_id != pEVar10->to_id) {
          puVar1 = puVar2 + pEVar10->from_id;
          *puVar1 = *puVar1 + 1;
          puVar1 = puVar3 + pEVar10->to_id;
          *puVar1 = *puVar1 + 1;
          this->numOfEdges = this->numOfEdges + 1;
        }
      }
      puVar2 = (this->deadend_vertices).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->deadend_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish != puVar2) {
        (this->deadend_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = puVar2;
      }
      uVar16 = 0;
      uVar13 = 0;
      while( true ) {
        uVar7 = (uint)uVar13;
        _attribute_file = (char *)CONCAT44(uStack_234,uVar7);
        if (this->numOfVertices <= uVar7) break;
        uVar14 = (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar13];
        if (uVar14 == 0) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->deadend_vertices,
                     (uint *)&attribute_file);
          uVar14 = (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start[(ulong)_attribute_file & 0xffffffff];
          uVar7 = _attribute_file;
        }
        if (uVar16 <= uVar14) {
          uVar16 = uVar14;
        }
        uVar13 = (ulong)(uVar7 + 1);
      }
      this->num_deadend_vertices =
           (VertexIdType)
           ((ulong)((long)(this->deadend_vertices).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->deadend_vertices).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2);
      printf("The number of dead end vertices:%d\n");
      puVar2 = (this->start_pos_in_appearance_pos_lists).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->start_pos_in_appearance_pos_lists).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar2) {
        (this->start_pos_in_appearance_pos_lists).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar2;
      }
      _attribute_file = (char *)((ulong)_attribute_file & 0xffffffff00000000);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&this->start_pos_in_appearance_pos_lists,(ulong)(this->numOfVertices + 2),
                 (value_type_conflict1 *)&attribute_file);
      puVar2 = (this->start_pos_in_appearance_pos_lists).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar13 = 1; uVar13 < this->numOfVertices; uVar13 = uVar13 + 1) {
        puVar2[uVar13] = puVar3[uVar13 - 1] + puVar2[uVar13 - 1];
      }
      (this->start_pos_in_appearance_pos_lists).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[this->numOfVertices] = this->numOfEdges;
      puVar2 = (this->start_pos_in_out_neighbor_lists).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->start_pos_in_out_neighbor_lists).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar2) {
        (this->start_pos_in_out_neighbor_lists).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar2;
      }
      _attribute_file = (char *)((ulong)_attribute_file & 0xffffffff00000000);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&this->start_pos_in_out_neighbor_lists,(ulong)(this->numOfVertices + 2),
                 (value_type_conflict1 *)&attribute_file);
      puVar2 = (this->start_pos_in_out_neighbor_lists).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar13 = 1; uVar13 < this->numOfVertices + 1; uVar13 = uVar13 + 1) {
        uVar7 = puVar3[uVar13 - 1];
        puVar2[uVar13] = uVar7 + puVar2[uVar13 - 1] + (uint)(uVar7 == 0);
      }
      (this->out_degrees).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[this->dummy_id] = 0;
      __first._M_current =
           (this->start_pos_in_out_neighbor_lists).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
      __first._M_current[this->numOfVertices + 1] = __first._M_current[this->numOfVertices];
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&out_positions_to_fill,__first
                 ,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   )(this->start_pos_in_out_neighbor_lists).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish,(allocator_type *)&attribute_file);
      puVar2 = (this->out_neighbors_lists).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->out_neighbors_lists).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar2) {
        (this->out_neighbors_lists).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = puVar2;
      }
      _attribute_file = (char *)((ulong)_attribute_file & 0xffffffff00000000);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&this->out_neighbors_lists,
                 (ulong)(this->numOfEdges + uVar16 + this->num_deadend_vertices),
                 (value_type_conflict1 *)&attribute_file);
      uVar7 = this->numOfEdges / 10;
      position_pair.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      position_pair.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar7 = uVar7 + (uVar7 == 0);
      position_pair.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::reserve(&position_pair,(ulong)this->numOfEdges);
      pEVar10 = edges.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                super__Vector_impl_data._M_finish;
      uVar14 = 0;
      for (__args = &(edges.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                      super__Vector_impl_data._M_start)->to_id; (Edge *)(__args + -1) != pEVar10;
          __args = __args + 2) {
        if (((Edge *)(__args + -1))->from_id != *__args) {
          puVar12 = out_positions_to_fill.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start + ((Edge *)(__args + -1))->from_id;
          (this->out_neighbors_lists).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[*puVar12] = *__args;
          std::
          vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
          ::emplace_back<unsigned_int_const&,unsigned_int&>
                    ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                      *)&position_pair,__args,puVar12);
          uVar14 = uVar14 + 1;
          *puVar12 = *puVar12 + 1;
          if (uVar14 % uVar7 == 0) {
            printf("%u edges processed.\n",(ulong)uVar14);
          }
        }
      }
      if (edges.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          edges.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        edges.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
        _M_finish = edges.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      poVar11 = std::operator<<((ostream *)&std::cout,"edges_processed");
      poVar11 = std::operator<<(poVar11,":");
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::endl<char,std::char_traits<char>>(poVar11);
      _attribute_file = local_228;
      std::__cxx11::string::_M_construct((ulong)&attribute_file,'\x1e');
      puts(_attribute_file);
      std::__cxx11::string::~string((string *)&attribute_file);
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&in_positions_to_fill,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )(this->start_pos_in_appearance_pos_lists).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )(this->start_pos_in_appearance_pos_lists).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(allocator_type *)&attribute_file);
      in_positions_to_fill.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[this->numOfVertices] = this->numOfEdges;
      getCurrentTime();
      std::
      __sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_int>*,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<void>>>
                (position_pair.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 position_pair.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      getCurrentTime();
      _attribute_file = local_228;
      std::__cxx11::string::_M_construct((ulong)&attribute_file,'\x1e');
      puts(_attribute_file);
      std::__cxx11::string::~string((string *)&attribute_file);
      puVar2 = (this->appearance_pos_lists).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->appearance_pos_lists).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar2) {
        (this->appearance_pos_lists).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar2;
      }
      _attribute_file = (char *)((ulong)_attribute_file & 0xffffffff00000000);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&this->appearance_pos_lists,
                 (ulong)(uVar16 + this->numOfEdges + this->num_deadend_vertices),
                 (value_type_conflict1 *)&attribute_file);
      ppVar5 = position_pair.
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar13 = 1;
      for (ppVar15 = position_pair.
                     super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppVar15 != ppVar5;
          ppVar15 = ppVar15 + 1) {
        uVar16 = ppVar15->first;
        (this->appearance_pos_lists).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
        ._M_impl.super__Vector_impl_data._M_start
        [in_positions_to_fill.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_start[uVar16]] = ppVar15->second;
        in_positions_to_fill.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
        .super__Vector_impl_data._M_start[uVar16] =
             in_positions_to_fill.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar16] + 1;
        if ((int)(uVar13 % (ulong)uVar7) == 0) {
          poVar11 = std::operator<<((ostream *)&std::cout,"in_pos_pair");
          poVar11 = std::operator<<(poVar11,":");
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
          std::endl<char,std::char_traits<char>>(poVar11);
        }
        uVar13 = (ulong)((int)uVar13 + 1);
      }
      puVar2 = (this->out_neighbors_lists).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar4 = (this->deadend_vertices).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar12 = (this->deadend_vertices).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start; puVar12 != puVar4; puVar12 = puVar12 + 1) {
        uVar16 = this->dummy_id;
        uVar7 = out_positions_to_fill.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[*puVar12];
        out_positions_to_fill.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start[*puVar12] = uVar7 + 1;
        puVar2[uVar7] = uVar16;
      }
      dVar18 = getCurrentTime();
      printf("Graph Build Finished. TIME: %.4f\n",dVar18 - dVar17);
      _attribute_file = local_228;
      std::__cxx11::string::_M_construct((ulong)&attribute_file,'n');
      puts(_attribute_file);
      std::__cxx11::string::~string((string *)&attribute_file);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&in_positions_to_fill.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::
      _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::~_Vector_base(&position_pair.
                       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     );
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&out_positions_to_fill.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<Edge,_std::allocator<Edge>_>::~_Vector_base
                (&edges.super__Vector_base<Edge,_std::allocator<Edge>_>);
      return;
    }
    puts("Graph::read; File Not Exists.");
    poVar11 = std::operator<<((ostream *)&std::cout,(string *)_graph_file);
    std::endl<char,std::char_traits<char>>(poVar11);
  }
  exit(1);
}

Assistant:

void read_binary(const std::string &_attribute_file,
                     const std::string &_graph_file) {
        {
            std::string line;
            std::ifstream attribute_file(_attribute_file);
            if (attribute_file.is_open()) {
                std::getline(attribute_file, line);
                size_t start1 = line.find_first_of('=');
                numOfVertices = std::stoul(line.substr(start1 + 1));
                std::getline(attribute_file, line);
                size_t start2 = line.find_first_of('=');
                numOfEdges = std::stoul(line.substr(start2 + 1));
                dummy_id = numOfVertices;
                printf("The Number of Vertices: %d\n", numOfVertices);
                printf("The Number of Edges: %d\n", numOfEdges);
                attribute_file.close();
            } else {
                printf(__FILE__ "; LINE %d; File Not Exists.\n", __LINE__);
                std::cout << _attribute_file << std::endl;
                exit(1);
            }
        }
        const auto start = getCurrentTime();
        // create temporary graph
        std::vector<Edge> edges(numOfEdges);
        if (std::FILE *f = std::fopen(_graph_file.c_str(), "rb")) {
            size_t rtn = std::fread(edges.data(), sizeof edges[0], edges.size(), f);
            printf("Returned Value of fread: %zu\n", rtn);
            std::fclose(f);
        } else {
            printf("Graph::read; File Not Exists.\n");
            std::cout << _graph_file << std::endl;
            exit(1);
        }
        const auto end = getCurrentTime();
        printf("Time Used For Loading BINARY : %.2f\n", end - start);

        // read the edges
        // the ids must be in the range from [0 .... the number of vertices - 1];
        numOfEdges = 0;
        out_degrees.clear();
        out_degrees.resize(numOfVertices + 2, 0);
        in_degrees.clear();
        in_degrees.resize(numOfVertices + 2, 0);
        for (auto &edge : edges) {
            const VertexIdType &from_id = edge.from_id;
            const VertexIdType &to_id = edge.to_id;
            // remove self loop
            if (from_id != to_id) {
                //the edge read is a directed one
                ++out_degrees[from_id];
                ++in_degrees[to_id];
                ++numOfEdges;
            }
        }
        /* final count */
//        printf("%d-th Directed Edge Processed.\n", numOfEdges);

        // sort the adj list
//        for (auto &neighbors : matrix) {
//            std::sort(neighbors.begin(), neighbors.end());
//        }

        // process the dead_end
        uint32_t degree_max = 0;
        deadend_vertices.clear();
        for (VertexIdType i = 0; i < numOfVertices; ++i) {
            if (out_degrees[i] == 0) {
                deadend_vertices.emplace_back(i);
            }
            degree_max = std::max(degree_max, out_degrees[i]);
        }
        num_deadend_vertices = deadend_vertices.size();
        printf("The number of dead end vertices:%d\n", num_deadend_vertices);

        // process pos_list list
        start_pos_in_appearance_pos_lists.clear();
        start_pos_in_appearance_pos_lists.resize(numOfVertices + 2, 0);
        for (VertexIdType i = 0, j = 1; j < numOfVertices; ++i, ++j) {
            start_pos_in_appearance_pos_lists[j] = start_pos_in_appearance_pos_lists[i] + in_degrees[i];
        }
        start_pos_in_appearance_pos_lists[numOfVertices] = numOfEdges;

        // process out list
        start_pos_in_out_neighbor_lists.clear();
        start_pos_in_out_neighbor_lists.resize(numOfVertices + 2, 0);
        for (VertexIdType current_id = 0, next_id = 1; next_id < numOfVertices + 1; ++current_id, ++next_id) {
            start_pos_in_out_neighbor_lists[next_id] =
                    start_pos_in_out_neighbor_lists[current_id] + std::max(out_degrees[current_id], 1u);
        }
        // process dummy vertex
        assert(start_pos_in_out_neighbor_lists[numOfVertices] == numOfEdges + deadend_vertices.size());
        out_degrees[dummy_id] = 0;
        start_pos_in_out_neighbor_lists[numOfVertices + 1] = start_pos_in_out_neighbor_lists[numOfVertices];
        ////////////////////////////////////////////////////////////

        // compute the positions
        std::vector<VertexIdType> out_positions_to_fill(start_pos_in_out_neighbor_lists.begin(),
                                                        start_pos_in_out_neighbor_lists.end());
        // fill the edge list
        out_neighbors_lists.clear();
        out_neighbors_lists.resize(numOfEdges + num_deadend_vertices + degree_max, 0);
        uint32_t edges_processed = 0;
        uint32_t msg_gap = std::max(1u, numOfEdges / 10);
        std::vector<std::pair<VertexIdType, VertexIdType>> position_pair;
        position_pair.reserve(numOfEdges);
        for (auto &edge : edges) {
            const VertexIdType &from_id = edge.from_id;
            const VertexIdType &to_id = edge.to_id;
            // remove self loop
            if (from_id != to_id) {
                VertexIdType &out_position = out_positions_to_fill[from_id];
                assert(out_position < out_positions_to_fill[from_id + 1]);
                out_neighbors_lists[out_position] = to_id;
                position_pair.emplace_back(to_id, out_position);
                ++out_position;
                if (++edges_processed % msg_gap == 0) {
                    printf("%u edges processed.\n", edges_processed);
                }
            }
        }
        edges.clear();
        MSG(edges_processed);
        printf("%s\n", std::string(30, '-').c_str());
#ifdef USE_REVERSE_POS
        std::vector<VertexIdType> in_positions_to_fill(start_pos_in_appearance_pos_lists.begin(),
                                                       start_pos_in_appearance_pos_lists.end());
        in_positions_to_fill[numOfVertices] = numOfEdges;
        const double time_sort_start = getCurrentTime();
        std::sort(position_pair.begin(), position_pair.end(), std::less<>());
        const double time_sort_end = getCurrentTime();
//        MSG(time_sort_end - time_sort_start);
        printf("%s\n", std::string(30, '-').c_str());
        appearance_pos_lists.clear();
        appearance_pos_lists.resize(numOfEdges + num_deadend_vertices + degree_max, 0);
        uint32_t in_pos_pair = 0;
        for (const auto &pair : position_pair) {
            const VertexIdType &to_id = pair.first;
            const VertexIdType &pos = pair.second;
            VertexIdType &in_position = in_positions_to_fill[to_id];
            assert(in_position < in_positions_to_fill[to_id + 1]);
            appearance_pos_lists[in_position] = pos;
            ++in_position;
            if (++in_pos_pair % msg_gap == 0) {
                MSG(in_pos_pair);
            }
        }
#endif

        // fill the dummy ids
        for (const VertexIdType &id : deadend_vertices) {
            out_neighbors_lists[out_positions_to_fill[id]++] = dummy_id;
        }

#ifdef DEBUG_MODE
//        show();
        // sanity check
//        std::memcpy(in_positions_to_fill.data(), start_pos_in_appearance_pos_lists.data(),
//                    sizeof(VertexIdType) * numOfVertices);
//        for (uint32_t index = 0; index < numOfEdges + num_deadend_vertices; ++index) {
//            const VertexIdType id = out_neighbors_lists[index];
//            if (id != numOfVertices) {
//                VertexIdType &in_position = in_positions_to_fill[id];
//                if (appearance_pos_lists[in_position] != index) {
//                    printf("Error in " __FILE__  ", line %d, in position error.\n", __LINE__);
//                    MSG(index);
//                    MSG(id);
//                    MSG(in_position);
//                    exit(1);
//                }
//                ++in_position;
//            }
//        }
#endif
        const double time_end = getCurrentTime();
        printf("Graph Build Finished. TIME: %.4f\n", time_end - start);
        printf("%s\n", std::string(110, '-').c_str());

    }